

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::GLMRegressor::ByteSizeLong(GLMRegressor *this)

{
  uint uVar1;
  int iVar2;
  GLMRegressor_PostEvaluationTransform GVar3;
  GLMRegressor_DoubleArray *value;
  size_t sVar4;
  size_t sVar5;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  uint local_20;
  uint count_1;
  uint i;
  uint count;
  size_t total_size;
  GLMRegressor *this_local;
  
  uVar1 = weights_size(this);
  _i = (size_t)uVar1;
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    value = weights(this,local_20);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::GLMRegressor_DoubleArray>(value);
    _i = sVar4 + _i;
  }
  uVar1 = offset_size(this);
  sVar4 = (ulong)uVar1 * 8;
  if ((ulong)uVar1 != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar4);
    _i = sVar5 + 1 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar4);
  this->_offset_cached_byte_size_ = iVar2;
  _i = sVar4 + _i;
  GVar3 = postevaluationtransform(this);
  if (GVar3 != GLMRegressor_PostEvaluationTransform_NoTransform) {
    GVar3 = postevaluationtransform(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(GVar3);
    _i = sVar4 + 1 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar2;
  return _i;
}

Assistant:

size_t GLMRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMRegressor)
  size_t total_size = 0;

  // repeated .CoreML.Specification.GLMRegressor.DoubleArray weights = 1;
  {
    unsigned int count = this->weights_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->weights(i));
    }
  }

  // repeated double offset = 2;
  {
    unsigned int count = this->offset_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _offset_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.GLMRegressor.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}